

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

void __thiscall ODDLParser::Value::dump(Value *this,IOStreamBase *param_1)

{
  int16 iVar1;
  int32 iVar2;
  size_t sVar3;
  ostream *poVar4;
  char *__s;
  float v_1;
  double v;
  uchar local_1d;
  float local_1c;
  double local_18;
  
  switch(this->m_type) {
  case ddl_bool:
    poVar4 = std::ostream::_M_insert<bool>(true);
    break;
  case ddl_int8:
    local_1d = *this->m_data;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_1d,1);
    break;
  case ddl_int16:
    iVar1 = getInt16(this);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
    break;
  case ddl_int32:
    iVar2 = getInt32(this);
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    break;
  case ddl_int64:
    getInt64(this);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    break;
  case ddl_unsigned_int8:
  case ddl_unsigned_int16:
  case ddl_unsigned_int32:
  case ddl_unsigned_int64:
  case ddl_half:
  case ddl_ref:
    __s = "Not supported";
    sVar3 = 0xd;
LAB_00665d14:
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
    break;
  case ddl_float:
    memcpy(&local_1c,this->m_data,this->m_size);
    goto LAB_00665df3;
  case ddl_double:
    memcpy(&local_18,this->m_data,this->m_size);
    local_1c = (float)local_18;
LAB_00665df3:
    poVar4 = std::ostream::_M_insert<double>((double)local_1c);
    break;
  case ddl_string:
    __s = (char *)this->m_data;
    if ((uchar *)__s != (uchar *)0x0) {
      sVar3 = strlen(__s);
      goto LAB_00665d14;
    }
    poVar4 = (ostream *)&std::cout;
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x8d3310);
    break;
  case ddl_none:
    __s = "None";
    sVar3 = 4;
    goto LAB_00665d14;
  default:
    goto switchD_00665cfc_default;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
switchD_00665cfc_default:
  return;
}

Assistant:

void Value::dump( IOStreamBase &/*stream*/ ) {
    switch( m_type ) {
        case ddl_none:
            std::cout << "None" << std::endl;
            break;
        case ddl_bool:
            std::cout << getBool() << std::endl;
            break;
        case ddl_int8:
            std::cout << getInt8() << std::endl;
            break;
        case ddl_int16:
            std::cout << getInt16() << std::endl;
            break;
        case ddl_int32:
            std::cout << getInt32() << std::endl;
            break;
        case ddl_int64:
            std::cout << getInt64() << std::endl;
            break;
        case ddl_unsigned_int8:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int16:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int32:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_unsigned_int64:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_half:
            std::cout << "Not supported" << std::endl;
            break;
        case ddl_float:
            std::cout << getFloat() << std::endl;
            break;
        case ddl_double:
            std::cout << getDouble() << std::endl;
            break;
        case ddl_string:
            std::cout << getString() << std::endl;
            break;
        case ddl_ref:
            std::cout << "Not supported" << std::endl;
            break;
        default:
            break;
    }
}